

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

StringRef llvm::dwarf::ApplePropertyString(uint Prop)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  sVar2 = 0;
  pcVar1 = (char *)0x0;
  if ((int)Prop < 0x100) {
    if ((int)Prop < 0x10) {
      pcVar1 = (char *)0x0;
      sVar2 = 0;
      switch(Prop) {
      case 1:
        sVar2 = 0x1a;
        pcVar1 = "DW_APPLE_PROPERTY_readonly";
        break;
      case 2:
        sVar2 = 0x18;
        pcVar1 = "DW_APPLE_PROPERTY_getter";
        break;
      case 4:
        sVar2 = 0x18;
        pcVar1 = "DW_APPLE_PROPERTY_assign";
        break;
      case 8:
        sVar2 = 0x1b;
        pcVar1 = "DW_APPLE_PROPERTY_readwrite";
      }
    }
    else if ((int)Prop < 0x40) {
      if (Prop == 0x10) {
        sVar2 = 0x18;
        pcVar1 = "DW_APPLE_PROPERTY_retain";
      }
      else {
        pcVar1 = (char *)0x0;
        sVar2 = 0;
        if (Prop == 0x20) {
          sVar2 = 0x16;
          pcVar1 = "DW_APPLE_PROPERTY_copy";
        }
      }
    }
    else if (Prop == 0x40) {
      sVar2 = 0x1b;
      pcVar1 = "DW_APPLE_PROPERTY_nonatomic";
    }
    else if (Prop == 0x80) {
      sVar2 = 0x18;
      pcVar1 = "DW_APPLE_PROPERTY_setter";
    }
  }
  else if ((int)Prop < 0x800) {
    if (Prop == 0x100) {
      sVar2 = 0x18;
      pcVar1 = "DW_APPLE_PROPERTY_atomic";
    }
    else if (Prop == 0x200) {
      sVar2 = 0x16;
      pcVar1 = "DW_APPLE_PROPERTY_weak";
    }
    else if (Prop == 0x400) {
      sVar2 = 0x18;
      pcVar1 = "DW_APPLE_PROPERTY_strong";
    }
  }
  else if ((int)Prop < 0x2000) {
    if (Prop == 0x800) {
      sVar2 = 0x23;
      pcVar1 = "DW_APPLE_PROPERTY_unsafe_unretained";
    }
    else if (Prop == 0x1000) {
      sVar2 = 0x1d;
      pcVar1 = "DW_APPLE_PROPERTY_nullability";
    }
  }
  else if (Prop == 0x2000) {
    sVar2 = 0x21;
    pcVar1 = "DW_APPLE_PROPERTY_null_resettable";
  }
  else if (Prop == 0x4000) {
    sVar2 = 0x17;
    pcVar1 = "DW_APPLE_PROPERTY_class";
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::ApplePropertyString(unsigned Prop) {
  switch (Prop) {
  default:
    return StringRef();
#define HANDLE_DW_APPLE_PROPERTY(ID, NAME)                                     \
  case DW_APPLE_PROPERTY_##NAME:                                               \
    return "DW_APPLE_PROPERTY_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}